

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternAddressMapper.cpp
# Opt level: O2

void __thiscall
PatternAddressMapper::randomize_addresses
          (PatternAddressMapper *this,FuzzingParameterSet *fuzzing_params,
          vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
          *agg_access_patterns,bool verbose)

{
  size_t sVar1;
  PatternAddressMapper *pPVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  result_type_conflict1 rVar7;
  AggressorAccessPattern *acc_pattern;
  pointer pAVar8;
  mt19937 *gen;
  const_reference __k;
  size_type sVar9;
  mapped_type *pmVar10;
  const_reference __k_00;
  _Base_ptr p_Var11;
  size_type sVar12;
  long lVar13;
  undefined7 in_register_00000009;
  int *w;
  size_t i;
  unsigned_long uVar14;
  ulong __n;
  pointer pcVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  initializer_list<int> __l;
  undefined1 local_2858 [8];
  mt19937 engine;
  random_device device;
  discrete_distribution<int> dist;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> occupied_rows;
  undefined1 local_e0 [8];
  vector<int,_std::allocator<int>_> weights;
  string local_b0;
  int local_8c;
  PatternAddressMapper *local_88;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *local_80;
  vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *__range1;
  undefined1 local_70 [32];
  _Base_ptr local_50;
  pointer local_48;
  size_t row;
  allocator<char> local_32;
  bool local_31;
  
  __range1 = (vector<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_> *)
             &this->aggressor_to_addr;
  local_80 = agg_access_patterns;
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)__range1);
  this->bank_no = bank_counter;
  bank_counter = (bank_counter + 1) % 0x10;
  local_31 = FuzzingParameterSet::get_random_use_seq_addresses(fuzzing_params);
  row = (size_t)fuzzing_params;
  iVar4 = FuzzingParameterSet::get_random_start_row(fuzzing_params);
  local_8c = (int)CONCAT71(in_register_00000009,verbose);
  if (local_8c != 0) {
    FuzzingParameterSet::print_dynamic_parameters(this->bank_no,local_31,iVar4);
  }
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&occupied_rows;
  occupied_rows._M_t._M_impl._0_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  uVar14 = 0;
  for (pAVar8 = (local_80->
                super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar8 != (local_80->
                super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>)
                ._M_impl.super__Vector_impl_data._M_finish; pAVar8 = pAVar8 + 1) {
    uVar14 = uVar14 + ((long)(pAVar8->aggressors).
                             super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pAVar8->aggressors).
                             super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
  }
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2858,"[PatternAddressMapper] Target no. of DRAM rows = %d",
             (allocator<char> *)((long)&device.field_0 + 0x1380));
  iVar5 = FuzzingParameterSet::get_num_aggressors((FuzzingParameterSet *)row);
  format_string<int>((string *)&engine._M_p,(string *)local_2858,iVar5);
  Logger::log_info((string *)&engine._M_p,true);
  std::__cxx11::string::~string((string *)&engine._M_p);
  std::__cxx11::string::~string((string *)local_2858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2858,"[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d"
             ,(allocator<char> *)((long)&device.field_0 + 0x1380));
  format_string<unsigned_long>((string *)&engine._M_p,(string *)local_2858,uVar14);
  local_88 = this;
  Logger::log_info((string *)&engine._M_p,true);
  std::__cxx11::string::~string((string *)&engine._M_p);
  std::__cxx11::string::~string((string *)local_2858);
  iVar5 = FuzzingParameterSet::get_num_aggressors((FuzzingParameterSet *)row);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2858,
             "[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d",
             (allocator<char> *)((long)&device.field_0 + 0x1380));
  auVar18._8_4_ = (int)(uVar14 >> 0x20);
  auVar18._0_8_ = uVar14;
  auVar18._12_4_ = 0x45300000;
  dVar16 = (double)iVar5 /
           ((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0));
  dVar17 = 1.0;
  if (dVar16 <= 1.0) {
    dVar17 = dVar16;
  }
  iVar5 = 100 - (int)(dVar17 * 100.0);
  format_string<int>((string *)&engine._M_p,(string *)local_2858,iVar5);
  Logger::log_info((string *)&engine._M_p,true);
  std::__cxx11::string::~string((string *)&engine._M_p);
  std::__cxx11::string::~string((string *)local_2858);
  std::random_device::random_device((random_device *)&engine._M_p);
  uVar6 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_2858,(ulong)uVar6);
  __l._M_len = 2;
  __l._M_array = (iterator)((long)&device.field_0 + 0x1380);
  device.field_0._M_mt._M_p._0_4_ = (int)(dVar17 * 100.0);
  device.field_0._M_mt._M_p._4_4_ = iVar5;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_e0,__l,(allocator_type *)local_70);
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((param_type *)((long)&device.field_0 + 0x1380),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_e0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"[PatternAddressMapper] weights =",(allocator<char> *)&local_b0);
  Logger::log_info((string *)local_70,true);
  pcVar15 = (pointer)(long)iVar4;
  std::__cxx11::string::~string((string *)local_70);
  for (; local_e0 !=
         (undefined1  [8])
         weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start; local_e0 = (undefined1  [8])((long)local_e0 + 4)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"%d",&local_32);
    format_string<int>((string *)local_70,&local_b0,*(int *)local_e0);
    Logger::log_data((string *)local_70,true);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  pAVar8 = (local_80->
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
           _M_impl.super__Vector_impl_data._M_start;
  occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)(local_80->
               super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>).
               _M_impl.super__Vector_impl_data._M_finish;
  gen = &local_88->gen;
  do {
    pPVar2 = local_88;
    if (pAVar8 == (pointer)occupied_rows._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      determine_victims(local_88,local_80);
      pPVar2->min_row =
           *(size_t *)(occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 1);
      lVar13 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&occupied_rows);
      pPVar2->max_row = *(size_t *)(lVar13 + 0x20);
      if ((char)local_8c != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Found %d different aggressors (IDs) in pattern.",&local_32);
        format_string<unsigned_long>
                  ((string *)local_70,&local_b0,(pPVar2->aggressor_to_addr)._M_h._M_element_count);
        Logger::log_info((string *)local_70,true);
        std::__cxx11::string::~string((string *)local_70);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::discrete_distribution<int>::param_type::~param_type
                ((param_type *)((long)&device.field_0 + 0x1380));
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_e0);
      std::random_device::~random_device((random_device *)&engine._M_p);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)&pAVar8->aggressors;
    for (__n = 0; __n < (ulong)((long)*(pointer *)
                                       ((long)&(pAVar8->aggressors).
                                               super__Vector_base<Aggressor,_std::allocator<Aggressor>_>
                                               ._M_impl + 8) -
                                *(long *)&(pAVar8->aggressors).
                                          super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                                          _M_impl.super__Vector_impl_data >> 2); __n = __n + 1) {
      __k = std::vector<Aggressor,_std::allocator<Aggressor>_>::at
                      ((vector<Aggressor,_std::allocator<Aggressor>_> *)
                       weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,__n);
      sVar9 = std::
              _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count((_Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)__range1,&__k->id);
      if (sVar9 == 0) {
        if (__n == 0) {
          iVar4 = FuzzingParameterSet::get_agg_inter_distance((FuzzingParameterSet *)row);
          iVar5 = FuzzingParameterSet::get_max_row_no((FuzzingParameterSet *)row);
          pcVar15 = (pointer)((ulong)(pcVar15 + iVar4) % (ulong)(long)iVar5);
          rVar7 = std::discrete_distribution<int>::operator()
                            ((discrete_distribution<int> *)((long)&device.field_0 + 0x1380),
                             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)local_2858);
          if ((rVar7 == 0) ||
             (occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)
             ) {
            iVar4 = 7;
            do {
              pcVar3 = pcVar15;
              if (local_31 != false) goto LAB_001324f7;
              iVar5 = FuzzingParameterSet::get_max_row_no((FuzzingParameterSet *)row);
              local_70._8_8_ = pcVar15 + iVar5;
              local_70._16_8_ = 1;
              local_70._0_8_ = pcVar15;
              local_70._24_8_ = pcVar15;
              local_50 = (_Base_ptr)local_70._8_8_;
              uVar14 = Range<unsigned_long>::get_random_number((Range<unsigned_long> *)local_70,gen)
              ;
              iVar5 = FuzzingParameterSet::get_max_row_no((FuzzingParameterSet *)row);
              local_48 = (pointer)(uVar14 % (ulong)(long)iVar5);
              sVar12 = std::
                       set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                *)&dist._M_param._M_cp.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,(key_type *)&local_48);
              pcVar3 = local_48;
              if (sVar12 == 0) goto LAB_001324f7;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,
                       "Assigning unique addresses for Aggressor ID %d didn\'t succeed. Giving up after 3 trials."
                       ,&local_32);
            format_string<int>((string *)local_70,&local_b0,__k->id);
            Logger::log_info((string *)local_70,true);
            std::__cxx11::string::~string((string *)local_70);
            std::__cxx11::string::~string((string *)&local_b0);
            pcVar3 = local_48;
          }
          else {
            local_70._0_8_ = (pointer)0x1;
            local_70._8_8_ = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            local_70._16_8_ = 1;
            local_70._24_8_ = (pointer)0x1;
            local_50 = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
            uVar14 = Range<unsigned_long>::get_random_number((Range<unsigned_long> *)local_70,gen);
            p_Var11 = occupied_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            while (uVar14 = uVar14 - 1, uVar14 != 0) {
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
            }
            pcVar3 = *(pointer *)(p_Var11 + 1);
          }
        }
        else {
          __k_00 = std::vector<Aggressor,_std::allocator<Aggressor>_>::at
                             ((vector<Aggressor,_std::allocator<Aggressor>_> *)
                              weights.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,__n - 1);
          pmVar10 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)__range1,&__k_00->id);
          sVar1 = pmVar10->row;
          iVar4 = FuzzingParameterSet::get_agg_intra_distance((FuzzingParameterSet *)row);
          iVar5 = FuzzingParameterSet::get_max_row_no((FuzzingParameterSet *)row);
          pcVar15 = (pointer)((sVar1 + (long)iVar4) % (ulong)(long)iVar5);
          pcVar3 = pcVar15;
        }
      }
      else {
        pmVar10 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)__range1,&__k->id);
        pcVar3 = (pointer)pmVar10->row;
      }
LAB_001324f7:
      local_48 = pcVar3;
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&local_48);
      DRAMAddr::DRAMAddr((DRAMAddr *)&local_b0,(long)local_88->bank_no,(size_t)local_48,0);
      local_70._0_4_ = __k->id;
      local_70._24_8_ = local_b0.field_2._M_allocated_capacity;
      local_70._8_8_ = local_b0._M_dataplus._M_p;
      local_70._16_8_ = local_b0._M_string_length;
      std::
      _Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<int,DRAMAddr>>
                ((_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)__range1,local_70);
    }
    pAVar8 = pAVar8 + 1;
  } while( true );
}

Assistant:

void PatternAddressMapper::randomize_addresses(FuzzingParameterSet &fuzzing_params,
                                               const std::vector<AggressorAccessPattern> &agg_access_patterns,
                                               bool verbose) {
  // clear any already existing mapping
  aggressor_to_addr.clear();

  // retrieve and then store randomized values as they should be the same for all added addresses
  // (store bank_no as field for get_random_nonaccessed_rows)
  bank_no = PatternAddressMapper::bank_counter;
  PatternAddressMapper::bank_counter = (PatternAddressMapper::bank_counter + 1) % NUM_BANKS;
  const bool use_seq_addresses = fuzzing_params.get_random_use_seq_addresses();
  const int start_row = fuzzing_params.get_random_start_row();
  if (verbose) FuzzingParameterSet::print_dynamic_parameters(bank_no, use_seq_addresses, start_row);

  auto cur_row = static_cast<size_t>(start_row);

  // a set of DRAM rows that are already assigned to aggressors
  std::set<size_t> occupied_rows;

  // we can make use here of the fact that each aggressor (identified by its ID) has a fixed N, that means, is
  // either accessed individually (N=1) or in a group of multiple aggressors (N>1; e.g., N=2 for double sided)
  // => if we already know the address of any aggressor in an aggressor access pattern, we already must know
  // addresses for all of them as we must have accessed all of them together before
  size_t row;
  int assignment_trial_cnt = 0;

  size_t total_abstract_aggs = 0;
  for (auto &acc_pattern : agg_access_patterns) total_abstract_aggs += acc_pattern.aggressors.size();
  Logger::log_info(format_string("[PatternAddressMapper] Target no. of DRAM rows = %d",
      fuzzing_params.get_num_aggressors()));
  Logger::log_info(format_string("[PatternAddressMapper] Aggressors in AggressorAccessPattern = %d",
      total_abstract_aggs));

  // probability to map aggressor to same row as another aggressor is already mapped to
  const int prob2 = 100 - (
      static_cast<int>(
          std::min(static_cast<double>(fuzzing_params.get_num_aggressors())/static_cast<double>(total_abstract_aggs),1.0)*100));
  Logger::log_info(format_string("[PatternAddressMapper] Probability to map multiple AAPs to same DRAM row = %d", prob2));

  std::random_device device;
  std::mt19937 engine(device()); // Seed the random number engine
  std::vector<int> weights = std::vector<int>({100-prob2, prob2});
  std::discrete_distribution<> dist(weights.begin(), weights.end()); // Create the distribution

  Logger::log_info("[PatternAddressMapper] weights =");
  for (const auto &w : weights) {
    Logger::log_data(format_string("%d", w));
  }

//  Logger::log_info("Generating 1k random numbers to see how well distribution works ");
//  size_t cnt_0 = 0;
//  size_t cnt_1 = 0;
//  for (size_t i = 0; i < 1000; ++i) {
//    if (dist(engine) == 0)
//      cnt_0++;
//    else
//      cnt_1++;
//  }
//  Logger::log_info(format_string("cnt_0 = %lu", cnt_0));
//  Logger::log_info(format_string("cnt_1 = %lu", cnt_1));

  for (auto &acc_pattern : agg_access_patterns) {
    for (size_t i = 0; i < acc_pattern.aggressors.size(); i++) {
      const Aggressor &current_agg = acc_pattern.aggressors.at(i);

      // aggressor has existing row mapping OR
      if (aggressor_to_addr.count(current_agg.id) > 0) {
        row = aggressor_to_addr.at(current_agg.id).row;
      } else if (i > 0) {  // aggressor is part of a n>1 aggressor tuple
        // we need to add the appropriate distance and cannot choose randomly
        auto last_addr = aggressor_to_addr.at(acc_pattern.aggressors.at(i - 1).id);
        // update cur_row for its next use (note that here it is: cur_row = last_addr.row)
        cur_row = (last_addr.row + (size_t) fuzzing_params.get_agg_intra_distance())%fuzzing_params.get_max_row_no();
        row = cur_row;
      } else {
        // this is a new aggressor pair - we can choose where to place it
        // if use_seq_addresses is true, we use the last address and add the agg_inter_distance on top -> this is the
        //   row of the next aggressor
        // if use_seq_addresses is false, we just pick any random row no. between [0, 8192]
        cur_row = (cur_row + (size_t) fuzzing_params.get_agg_inter_distance())%fuzzing_params.get_max_row_no();

        bool map_to_existing_agg = dist(engine);
        if (map_to_existing_agg && !occupied_rows.empty()) {
            auto idx = Range<size_t>(1, occupied_rows.size()).get_random_number(gen)-1;
            auto it = occupied_rows.begin();
            while (idx--) it++;
            row = *it;
        } else {
        retry:
          row = use_seq_addresses ?
                cur_row :
                (Range<size_t>(cur_row, cur_row + fuzzing_params.get_max_row_no()).get_random_number(gen)
                    %fuzzing_params.get_max_row_no());

          // check that we haven't assigned this address yet to another aggressor ID
          // if use_seq_addresses is True, the only way that the address is already assigned is that we already flipped
          // around the address range once (because of the modulo operator) so that retrying doesn't make sense
          if (!use_seq_addresses && occupied_rows.count(row) > 0) {
            assignment_trial_cnt++;
            if (assignment_trial_cnt < 7) goto retry;
            Logger::log_info(format_string(
                "Assigning unique addresses for Aggressor ID %d didn't succeed. Giving up after 3 trials.",
                current_agg.id));
          }
        }
      }

      assignment_trial_cnt = 0;
      occupied_rows.insert(row);
      aggressor_to_addr.insert(std::make_pair(current_agg.id, DRAMAddr(static_cast<size_t>(bank_no), row, 0)));
    }
  }

  // determine victim rows
  determine_victims(agg_access_patterns);

  // this works as sets are always ordered
  min_row = *occupied_rows.begin();
  max_row = *occupied_rows.rbegin();

  if (verbose)
    Logger::log_info(format_string("Found %d different aggressors (IDs) in pattern.", aggressor_to_addr.size()));
}